

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

void t1_dec_refpass_step_raw(opj_t1_t *t1,flag_t *flagsp,int *datap,int poshalf,int neghalf,int vsc)

{
  ushort uVar1;
  int iVar2;
  int in_ECX;
  int *in_RDX;
  ushort *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  opj_raw_t *raw;
  int flag;
  int t;
  int v;
  int local_44;
  int local_40;
  
  if (in_R9D == 0) {
    uVar1 = *in_RSI;
  }
  else {
    uVar1 = *in_RSI & 0xfbb9;
  }
  if ((uVar1 & 0x5000) == 0x1000) {
    iVar2 = raw_decode(*(opj_raw_t **)(in_RDI + 0x10));
    local_40 = in_R8D;
    if (iVar2 != 0) {
      local_40 = in_ECX;
    }
    if (*in_RDX < 0) {
      local_44 = -local_40;
    }
    else {
      local_44 = local_40;
    }
    *in_RDX = local_44 + *in_RDX;
    *in_RSI = *in_RSI | 0x2000;
  }
  return;
}

Assistant:

static INLINE void t1_dec_refpass_step_raw(
		opj_t1_t *t1,
		flag_t *flagsp,
		int *datap,
		int poshalf,
		int neghalf,
		int vsc)
{
	int v, t, flag;
	
	opj_raw_t *raw = t1->raw;	/* RAW component */
	
	flag = vsc ? ((*flagsp) & (~(T1_SIG_S | T1_SIG_SE | T1_SIG_SW | T1_SGN_S))) : (*flagsp);
	if ((flag & (T1_SIG | T1_VISIT)) == T1_SIG) {
			v = raw_decode(raw);
		t = v ? poshalf : neghalf;
		*datap += *datap < 0 ? -t : t;
		*flagsp |= T1_REFINE;
	}
}